

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_send2cluster(fio_msg_internal_s *m)

{
  int iVar1;
  
  if ((fio_data == (fio_data_s *)0x0) || (fio_data->active == '\0')) {
    if (1 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("ERROR: facio.io cluster inactive, can\'t send message.");
      return;
    }
  }
  else if (fio_data->workers != 1) {
    iVar1 = fio_is_master();
    LOCK();
    m->ref = m->ref + 1;
    UNLOCK();
    if (iVar1 != 0) {
      fio_cluster_server_sender(m,-1);
      return;
    }
    fio_cluster_client_sender(m,-1);
    return;
  }
  return;
}

Assistant:

static void fio_send2cluster(fio_msg_internal_s *m) {
  if (!fio_is_running()) {
    FIO_LOG_ERROR("facio.io cluster inactive, can't send message.");
    return;
  }
  if (fio_data->workers == 1) {
    /* nowhere to send to */
    return;
  }
  if (fio_is_master()) {
    fio_cluster_server_sender(fio_msg_internal_dup(m), -1);
  } else {
    fio_cluster_client_sender(fio_msg_internal_dup(m), -1);
  }
}